

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_info.cpp
# Opt level: O3

Value * duckdb::DefaultValue(Value *__return_storage_ptr__,ColumnDefinition *def)

{
  Value *pVVar1;
  bool bVar2;
  ParsedExpression *pPVar3;
  Value *extraout_RAX;
  Value *extraout_RAX_00;
  Value *pVVar4;
  LogicalType LStack_68;
  string local_50;
  undefined1 local_30 [32];
  
  bVar2 = ColumnDefinition::Generated(def);
  if (bVar2) {
    pPVar3 = ColumnDefinition::GeneratedExpression(def);
    (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[8])((string *)local_30,pPVar3);
    Value::Value(__return_storage_ptr__,(string *)local_30);
    pVVar4 = (Value *)(local_30 + 0x10);
  }
  else {
    bVar2 = ColumnDefinition::HasDefaultValue(def);
    if (!bVar2) {
      LogicalType::LogicalType(&LStack_68,SQLNULL);
      Value::Value(__return_storage_ptr__,&LStack_68);
      LogicalType::~LogicalType(&LStack_68);
      return extraout_RAX_00;
    }
    pPVar3 = ColumnDefinition::DefaultValue(def);
    (*(pPVar3->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pPVar3);
    Value::Value(__return_storage_ptr__,&local_50);
    pVVar4 = (Value *)&local_50.field_2;
  }
  pVVar1 = (Value *)pVVar4[-1].value_info_.internal.
                    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pVVar1 != pVVar4) {
    operator_delete(pVVar1);
    pVVar4 = extraout_RAX;
  }
  return pVVar4;
}

Assistant:

static Value DefaultValue(const ColumnDefinition &def) {
	if (def.Generated()) {
		return Value(def.GeneratedExpression().ToString());
	}
	if (!def.HasDefaultValue()) {
		return Value();
	}
	auto &value = def.DefaultValue();
	return Value(value.ToString());
}